

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

bool __thiscall inja::Parser::parse_statement(Parser *this,Template *tmpl,string_view path)

{
  Token *this_00;
  pointer *ppuVar1;
  pointer pBVar2;
  uint *puVar3;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_02;
  basic_string_view<char,_std::char_traits<char>_> lhs_03;
  basic_string_view<char,_std::char_traits<char>_> lhs_04;
  basic_string_view<char,_std::char_traits<char>_> lhs_05;
  basic_string_view<char,_std::char_traits<char>_> lhs_06;
  bool bVar4;
  Kind KVar5;
  int iVar6;
  ulong uVar7;
  uint *puVar8;
  pointer puVar9;
  pointer pIVar10;
  type rhs;
  type rhs_00;
  type rhs_01;
  type rhs_02;
  type rhs_03;
  type rhs_04;
  type rhs_05;
  type rhs_06;
  allocator local_151;
  string pathname;
  Template include_template;
  string local_f8;
  json json_name;
  Token value_token;
  Token key_token;
  string_view path_local;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  
  path_local.size_ = path.size_;
  path_local.data_ = path.data_;
  if ((this->m_tok).kind == Id) {
    lhs.data_ = (this->m_tok).text.data_;
    lhs.size_ = (this->m_tok).text.size_;
    rhs.size_ = 2;
    rhs.data_ = "if";
    bVar4 = nonstd::sv_lite::operator==(lhs,rhs);
    if (bVar4) {
      get_next_token(this);
      bVar4 = parse_expression(this,tmpl);
      if (!bVar4) goto LAB_0019b185;
      include_template.bytecodes.super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(((long)(tmpl->bytecodes).
                            super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(tmpl->bytecodes).
                           super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x38);
      std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::
      emplace_back<unsigned_long>(&this->m_if_stack,(unsigned_long *)&include_template);
      include_template.bytecodes.super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(include_template.bytecodes.
                             super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,0x2b);
      std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::emplace_back<inja::Bytecode::Op>
                (&tmpl->bytecodes,(Op *)&include_template);
    }
    else {
      lhs_00.data_ = (this->m_tok).text.data_;
      lhs_00.size_ = (this->m_tok).text.size_;
      rhs_00.size_ = 5;
      rhs_00.data_ = "endif";
      bVar4 = nonstd::sv_lite::operator==(lhs_00,rhs_00);
      if (bVar4) {
        pIVar10 = (this->m_if_stack).
                  super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((this->m_if_stack).
            super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
            super__Vector_impl_data._M_start == pIVar10) {
          std::__cxx11::string::string
                    ((string *)&include_template,"parser_error",(allocator *)&json_name);
          std::__cxx11::string::string
                    ((string *)&pathname,"endif without matching if",(allocator *)&local_f8);
          inja_throw((string *)&include_template,&pathname);
          std::__cxx11::string::~string((string *)&pathname);
          std::__cxx11::string::~string((string *)&include_template);
          pIVar10 = (this->m_if_stack).
                    super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        get_next_token(this);
        uVar7 = (ulong)pIVar10[-1].prev_cond_jump;
        if (uVar7 != 0xffffffff) {
          pBVar2 = (tmpl->bytecodes).
                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(uint *)&pBVar2[uVar7].field_0x4 =
               *(uint *)&pBVar2[uVar7].field_0x4 & 0xc0000000 |
               (uint)(((long)(tmpl->bytecodes).
                             super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x38) &
               0x3fffffff;
        }
        puVar3 = pIVar10[-1].uncond_jumps.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar8 = pIVar10[-1].uncond_jumps.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1) {
          pBVar2 = (tmpl->bytecodes).
                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(uint *)&pBVar2[*puVar8].field_0x4 =
               *(uint *)&pBVar2[*puVar8].field_0x4 & 0xc0000000 |
               (uint)(((long)(tmpl->bytecodes).
                             super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x38) &
               0x3fffffff;
        }
        std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::pop_back
                  (&this->m_if_stack);
      }
      else {
        lhs_01.data_ = (this->m_tok).text.data_;
        lhs_01.size_ = (this->m_tok).text.size_;
        rhs_01.size_ = 4;
        rhs_01.data_ = "else";
        bVar4 = nonstd::sv_lite::operator==(lhs_01,rhs_01);
        if (bVar4) {
          pIVar10 = (this->m_if_stack).
                    super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if ((this->m_if_stack).
              super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
              _M_impl.super__Vector_impl_data._M_start == pIVar10) {
            std::__cxx11::string::string
                      ((string *)&include_template,"parser_error",(allocator *)&json_name);
            std::__cxx11::string::string
                      ((string *)&pathname,"else without matching if",(allocator *)&local_f8);
            inja_throw((string *)&include_template,&pathname);
            std::__cxx11::string::~string((string *)&pathname);
            std::__cxx11::string::~string((string *)&include_template);
            pIVar10 = (this->m_if_stack).
                      super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          get_next_token(this);
          include_template.bytecodes.
          super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(include_template.bytecodes.
                                 super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)(((long)(tmpl->bytecodes).
                                              super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(tmpl->bytecodes).
                                             super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x38));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&pIVar10[-1].uncond_jumps,(uint *)&include_template);
          include_template.bytecodes.
          super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(include_template.bytecodes.
                                 super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2a);
          std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
          emplace_back<inja::Bytecode::Op>(&tmpl->bytecodes,(Op *)&include_template);
          pBVar2 = (tmpl->bytecodes).
                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(uint *)&pBVar2[pIVar10[-1].prev_cond_jump].field_0x4 =
               *(uint *)&pBVar2[pIVar10[-1].prev_cond_jump].field_0x4 & 0xc0000000 |
               (uint)(((long)(tmpl->bytecodes).
                             super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x38) &
               0x3fffffff;
          pIVar10[-1].prev_cond_jump = 0xffffffff;
          if ((this->m_tok).kind != Id) {
            return true;
          }
          lhs_02.data_ = (this->m_tok).text.data_;
          lhs_02.size_ = (this->m_tok).text.size_;
          rhs_02.size_ = 2;
          rhs_02.data_ = "if";
          bVar4 = nonstd::sv_lite::operator==(lhs_02,rhs_02);
          if (!bVar4) {
            return true;
          }
          get_next_token(this);
          bVar4 = parse_expression(this,tmpl);
          if (bVar4) {
            pIVar10[-1].prev_cond_jump =
                 (uint)(((long)(tmpl->bytecodes).
                               super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(tmpl->bytecodes).
                              super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x38);
            include_template.bytecodes.
            super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(include_template.bytecodes.
                                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2b);
            std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
            emplace_back<inja::Bytecode::Op>(&tmpl->bytecodes,(Op *)&include_template);
            return true;
          }
          goto LAB_0019b185;
        }
        this_00 = &this->m_tok;
        lhs_03.data_ = (this->m_tok).text.data_;
        lhs_03.size_ = (this->m_tok).text.size_;
        rhs_03.size_ = 3;
        rhs_03.data_ = "for";
        bVar4 = nonstd::sv_lite::operator==(lhs_03,rhs_03);
        if (bVar4) {
          get_next_token(this);
          if ((this->m_tok).kind != Id) {
            std::__cxx11::string::string
                      ((string *)&include_template,"parser_error",(allocator *)&value_token);
            Token::describe_abi_cxx11_(&local_f8,this_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &json_name,"expected id, got \'",&local_f8);
            std::operator+(&pathname,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &json_name,"\'");
            inja_throw((string *)&include_template,&pathname);
            std::__cxx11::string::~string((string *)&pathname);
            std::__cxx11::string::~string((string *)&json_name);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&include_template);
          }
          value_token.text.size_ = (this->m_tok).text.size_;
          value_token.kind = this_00->kind;
          value_token._4_4_ = *(undefined4 *)&this_00->field_0x4;
          value_token.text.data_ = (this->m_tok).text.data_;
          get_next_token(this);
          key_token.kind = Unknown;
          key_token.text.data_ = (const_pointer)0x0;
          key_token.text.size_ = 0;
          KVar5 = (this->m_tok).kind;
          if (KVar5 == Comma) {
            get_next_token(this);
            if ((this->m_tok).kind != Id) {
              std::__cxx11::string::string((string *)&include_template,"parser_error",&local_151);
              Token::describe_abi_cxx11_(&local_f8,this_00);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &json_name,"expected id, got \'",&local_f8);
              std::operator+(&pathname,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &json_name,"\'");
              inja_throw((string *)&include_template,&pathname);
              std::__cxx11::string::~string((string *)&pathname);
              std::__cxx11::string::~string((string *)&json_name);
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&include_template);
            }
            key_token.text.size_ = value_token.text.size_;
            key_token.kind = value_token.kind;
            key_token._4_4_ = value_token._4_4_;
            key_token.text.data_ = value_token.text.data_;
            value_token.kind = this_00->kind;
            value_token._4_4_ = *(undefined4 *)&this_00->field_0x4;
            value_token.text.data_ = (this->m_tok).text.data_;
            value_token.text.size_ = (this->m_tok).text.size_;
            get_next_token(this);
            KVar5 = (this->m_tok).kind;
          }
          if ((KVar5 != Id) ||
             (lhs_04.data_ = (this->m_tok).text.data_, lhs_04.size_ = (this->m_tok).text.size_,
             rhs_04.size_ = 2, rhs_04.data_ = "in",
             bVar4 = nonstd::sv_lite::operator!=(lhs_04,rhs_04), bVar4)) {
            std::__cxx11::string::string((string *)&include_template,"parser_error",&local_151);
            Token::describe_abi_cxx11_(&local_f8,this_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &json_name,"expected \'in\', got \'",&local_f8);
            std::operator+(&pathname,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &json_name,"\'");
            inja_throw((string *)&include_template,&pathname);
            std::__cxx11::string::~string((string *)&pathname);
            std::__cxx11::string::~string((string *)&json_name);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&include_template);
          }
          get_next_token(this);
          bVar4 = parse_expression(this,tmpl);
          if (!bVar4) goto LAB_0019b185;
          include_template.bytecodes.
          super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(include_template.bytecodes.
                                 super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)(((long)(tmpl->bytecodes).
                                              super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(tmpl->bytecodes).
                                             super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x38));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&this->m_loop_stack,(uint *)&include_template);
          include_template.bytecodes.
          super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(include_template.bytecodes.
                                 super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2c);
          std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
          emplace_back<inja::Bytecode::Op>(&tmpl->bytecodes,(Op *)&include_template);
          if (key_token.text.size_ != 0) {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_0>
                      (&local_40,&key_token.text);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator=(&(tmpl->bytecodes).
                         super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl
                         .super__Vector_impl_data._M_finish[-1].value,&local_40);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_40);
          }
          nonstd::sv_lite::basic_string_view::operator_cast_to_string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &include_template,(basic_string_view *)&value_token.text);
          std::__cxx11::string::operator=
                    ((string *)
                     &(tmpl->bytecodes).
                      super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].str,(string *)&include_template);
          std::__cxx11::string::~string((string *)&include_template);
        }
        else {
          lhs_05.data_ = (this->m_tok).text.data_;
          lhs_05.size_ = (this->m_tok).text.size_;
          rhs_05.size_ = 6;
          rhs_05.data_ = "endfor";
          bVar4 = nonstd::sv_lite::operator==(lhs_05,rhs_05);
          if (bVar4) {
            get_next_token(this);
            puVar9 = (this->m_loop_stack).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if ((this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start == puVar9) {
              std::__cxx11::string::string
                        ((string *)&include_template,"parser_error",(allocator *)&json_name);
              std::__cxx11::string::string
                        ((string *)&pathname,"endfor without matching for",(allocator *)&local_f8);
              inja_throw((string *)&include_template,&pathname);
              std::__cxx11::string::~string((string *)&pathname);
              std::__cxx11::string::~string((string *)&include_template);
              puVar9 = (this->m_loop_stack).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            }
            pBVar2 = (tmpl->bytecodes).
                     super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(uint *)&pBVar2[puVar9[-1]].field_0x4 =
                 *(uint *)&pBVar2[puVar9[-1]].field_0x4 & 0xc0000000 |
                 (uint)(((long)(tmpl->bytecodes).
                               super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x38) &
                 0x3fffffff;
            include_template.bytecodes.
            super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(include_template.bytecodes.
                                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2d);
            std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
            emplace_back<inja::Bytecode::Op>(&tmpl->bytecodes,(Op *)&include_template);
            pBVar2 = (tmpl->bytecodes).
                     super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            *(uint *)&pBVar2[-1].field_0x4 =
                 *(uint *)&pBVar2[-1].field_0x4 & 0xc0000000 |
                 (this->m_loop_stack).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1] + 1 & 0x3fffffff;
            ppuVar1 = &(this->m_loop_stack).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + -1;
          }
          else {
            lhs_06.data_ = (this->m_tok).text.data_;
            lhs_06.size_ = (this->m_tok).text.size_;
            rhs_06.size_ = 7;
            rhs_06.data_ = "include";
            bVar4 = nonstd::sv_lite::operator==(lhs_06,rhs_06);
            if (!bVar4) goto LAB_0019b185;
            get_next_token(this);
            if ((this->m_tok).kind != String) {
              std::__cxx11::string::string
                        ((string *)&include_template,"parser_error",(allocator *)&value_token);
              Token::describe_abi_cxx11_(&local_f8,this_00);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &json_name,"expected string, got \'",&local_f8);
              std::operator+(&pathname,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &json_name,"\'");
              inja_throw((string *)&include_template,&pathname);
              std::__cxx11::string::~string((string *)&pathname);
              std::__cxx11::string::~string((string *)&json_name);
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&include_template);
            }
            nlohmann::detail::input_adapter::
            input_adapter<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_0>
                      ((input_adapter *)&include_template,&(this->m_tok).text);
            local_58 = 0;
            uStack_50 = 0;
            local_68._M_unused._M_object = (void *)0x0;
            local_68._8_8_ = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::parse(&json_name,(input_adapter *)&include_template,(parser_callback_t *)&local_68,
                    true);
            std::_Function_base::~_Function_base((_Function_base *)&local_68);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &include_template.bytecodes.
                        super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            nonstd::sv_lite::basic_string_view::operator_cast_to_string
                      (&pathname,(basic_string_view *)&path_local);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::
            get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                      (&json_name);
            std::__cxx11::string::append((string *)&pathname);
            iVar6 = std::__cxx11::string::compare((ulong)&pathname,0,(char *)0x2);
            if (iVar6 == 0) {
              std::__cxx11::string::erase((ulong)&pathname,0);
            }
            parse_template(&include_template,this,(string_view)pathname._0_16_);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
            ::_M_emplace_unique<std::__cxx11::string&,inja::Template&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                        *)this->m_included_templates,&pathname,&include_template);
            key_token.kind._0_1_ = 0x28;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_f8,&pathname);
            value_token.kind = ExpressionOpen;
            std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
            emplace_back<inja::Bytecode::Op,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,inja::Bytecode::Flag>
                      ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)tmpl,
                       (Op *)&key_token,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_f8,&value_token.kind);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)&local_f8);
            get_next_token(this);
            Template::~Template(&include_template);
            std::__cxx11::string::~string((string *)&pathname);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&json_name);
          }
        }
      }
    }
    bVar4 = true;
  }
  else {
LAB_0019b185:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool parse_statement(Template& tmpl, nonstd::string_view path) {
		if (m_tok.kind != Token::Kind::Id) return false;

		if (m_tok.text == "if") {
			get_next_token();

			// evaluate expression
			if (!parse_expression(tmpl)) return false;

			// start a new if block on if stack
			m_if_stack.emplace_back(tmpl.bytecodes.size());

			// conditional jump; destination will be filled in by else or endif
			tmpl.bytecodes.emplace_back(Bytecode::Op::ConditionalJump);
		} else if (m_tok.text == "endif") {
			if (m_if_stack.empty()) {
				inja_throw("parser_error", "endif without matching if");
			}
			auto& if_data = m_if_stack.back();
			get_next_token();

			// previous conditional jump jumps here
			if (if_data.prev_cond_jump != std::numeric_limits<unsigned int>::max()) {
				tmpl.bytecodes[if_data.prev_cond_jump].args = tmpl.bytecodes.size();
			}

			// update all previous unconditional jumps to here
			for (unsigned int i : if_data.uncond_jumps) {
				tmpl.bytecodes[i].args = tmpl.bytecodes.size();
			}

			// pop if stack
			m_if_stack.pop_back();
		} else if (m_tok.text == "else") {
			if (m_if_stack.empty()) inja_throw("parser_error", "else without matching if");
			auto& if_data = m_if_stack.back();
			get_next_token();

			// end previous block with unconditional jump to endif; destination will be
			// filled in by endif
			if_data.uncond_jumps.push_back(tmpl.bytecodes.size());
			tmpl.bytecodes.emplace_back(Bytecode::Op::Jump);

			// previous conditional jump jumps here
			tmpl.bytecodes[if_data.prev_cond_jump].args = tmpl.bytecodes.size();
			if_data.prev_cond_jump = std::numeric_limits<unsigned int>::max();

			// chained else if
			if (m_tok.kind == Token::Kind::Id && m_tok.text == "if") {
				get_next_token();

				// evaluate expression
				if (!parse_expression(tmpl)) return false;

				// update "previous jump"
				if_data.prev_cond_jump = tmpl.bytecodes.size();

				// conditional jump; destination will be filled in by else or endif
				tmpl.bytecodes.emplace_back(Bytecode::Op::ConditionalJump);
			}
		} else if (m_tok.text == "for") {
			get_next_token();

			// options: for a in arr; for a, b in obj
			if (m_tok.kind != Token::Kind::Id)
				inja_throw("parser_error", "expected id, got '" + m_tok.describe() + "'");
			Token value_token = m_tok;
			get_next_token();

			Token key_token;
			if (m_tok.kind == Token::Kind::Comma) {
				get_next_token();
				if (m_tok.kind != Token::Kind::Id)
					inja_throw("parser_error", "expected id, got '" + m_tok.describe() + "'");
				key_token = std::move(value_token);
				value_token = m_tok;
				get_next_token();
			}

			if (m_tok.kind != Token::Kind::Id || m_tok.text != "in")
				inja_throw("parser_error", "expected 'in', got '" + m_tok.describe() + "'");
			get_next_token();

			if (!parse_expression(tmpl)) return false;

			m_loop_stack.push_back(tmpl.bytecodes.size());

			tmpl.bytecodes.emplace_back(Bytecode::Op::StartLoop);
			if (!key_token.text.empty()) {
				tmpl.bytecodes.back().value = key_token.text;
			}
			tmpl.bytecodes.back().str = static_cast<std::string>(value_token.text);
		} else if (m_tok.text == "endfor") {
			get_next_token();
			if (m_loop_stack.empty()) {
				inja_throw("parser_error", "endfor without matching for");
			}

			// update loop with EndLoop index (for empty case)
			tmpl.bytecodes[m_loop_stack.back()].args = tmpl.bytecodes.size();

			tmpl.bytecodes.emplace_back(Bytecode::Op::EndLoop);
			tmpl.bytecodes.back().args = m_loop_stack.back() + 1;  // loop body
			m_loop_stack.pop_back();
		} else if (m_tok.text == "include") {
			get_next_token();

			if (m_tok.kind != Token::Kind::String) {
				inja_throw("parser_error", "expected string, got '" + m_tok.describe() + "'");
			}

			// build the relative path
			json json_name = json::parse(m_tok.text);
			std::string pathname = static_cast<std::string>(path);
			pathname += json_name.get_ref<const std::string&>();
			if (pathname.compare(0, 2, "./") == 0) {
				pathname.erase(0, 2);
			}
			// sys::path::remove_dots(pathname, true, sys::path::Style::posix);

			Template include_template = parse_template(pathname);
			m_included_templates.emplace(pathname, include_template);

			// generate a reference bytecode
			tmpl.bytecodes.emplace_back(Bytecode::Op::Include, json(pathname), Bytecode::Flag::ValueImmediate);

			get_next_token();
		} else {
			return false;
		}
		return true;
	}